

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

void LOADCallDllMain(DWORD dwReason,LPVOID lpReserved)

{
  bool bVar1;
  CPalThread *pCVar2;
  undefined8 uVar3;
  char *__format;
  MODSTRUCT *module;
  
  pCVar2 = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
  if (pCVar2 == (CPalThread *)0x0) {
    pCVar2 = CreateCurrentThreadData();
  }
  if (pCVar2->m_eThreadType != UserCreatedThread) {
    return;
  }
  switch((ulong)dwReason) {
  case 0:
    bVar1 = true;
    __format = "got called with DLL_PROCESS_DETACH parameter! Why?\n";
    uVar3 = 0x3cc;
    break;
  case 1:
    __format = "got called with DLL_PROCESS_ATTACH parameter! Why?\n";
    uVar3 = 0x3c9;
    bVar1 = false;
    break;
  case 2:
    if (PAL_InitializeChakraCoreCalled == false) {
LAB_0012da22:
      abort();
    }
    bVar1 = false;
    goto LAB_0012da6c;
  case 3:
    bVar1 = true;
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012da22;
    goto LAB_0012da6c;
  default:
    fprintf(_stderr,"] %s %s:%d","LOADCallDllMain",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/loader/module.cpp"
            ,0x3d7);
    fprintf(_stderr,"LOADCallDllMain called with unknown parameter %d!\n",(ulong)dwReason);
    return;
  }
  fprintf(_stderr,"] %s %s:%d","LOADCallDllMain",
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/loader/module.cpp"
          ,uVar3);
  fprintf(_stderr,__format);
LAB_0012da6c:
  LockModuleList();
  module = &exe_module;
  do {
    if (bVar1) {
      module = module->prev;
    }
    if ((module->threadLibCalls != 0) && (module->pDllMain != (PDLLMAIN)0x0)) {
      LOADCallDllMainSafe(module,dwReason,lpReserved);
    }
    if (!bVar1) {
      module = module->next;
    }
  } while (module != &exe_module);
  UnlockModuleList();
  return;
}

Assistant:

void LOADCallDllMain(DWORD dwReason, LPVOID lpReserved)
{
    MODSTRUCT *module = nullptr;
    BOOL InLoadOrder = TRUE; /* true if in load order, false for reverse */
    CPalThread *pThread;

    pThread = InternalGetCurrentThread();
    if (UserCreatedThread != pThread->GetThreadType())
    {
        return;
    }

    /* Validate dwReason */
    switch(dwReason)
    {
    case DLL_PROCESS_ATTACH:
        ASSERT("got called with DLL_PROCESS_ATTACH parameter! Why?\n");
        break;
    case DLL_PROCESS_DETACH:
        ASSERT("got called with DLL_PROCESS_DETACH parameter! Why?\n");
        InLoadOrder = FALSE;
        break;
    case DLL_THREAD_ATTACH:
        TRACE("Calling DllMain(DLL_THREAD_ATTACH) on all known modules.\n");
        break;
    case DLL_THREAD_DETACH:
        TRACE("Calling DllMain(DLL_THREAD_DETACH) on all known modules.\n");
        InLoadOrder = FALSE;
        break;
    default:
        ASSERT("LOADCallDllMain called with unknown parameter %d!\n", dwReason);
        return;
    }

    LockModuleList();

    module = &exe_module;

    do
    {
        if (!InLoadOrder)
            module = module->prev;

        if (module->threadLibCalls)
        {
            if (module->pDllMain)
            {
                LOADCallDllMainSafe(module, dwReason, lpReserved);
            }
        }

        if (InLoadOrder)
            module = module->next;

    } while (module != &exe_module);

    UnlockModuleList();
}